

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O2

void findOptimalFlags(char **FLAG,int height,int width,int *imax,int *jmax)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  char cVar14;
  
  if (((jmax != (int *)0x0 && (imax != (int *)0x0 && FLAG != (char **)0x0)) &&
      (width != 0 && height != 0)) &&
     (pvVar6 = malloc((long)(short)height * 2), pvVar6 != (void *)0x0)) {
    uVar7 = 0;
    uVar9 = 0;
    if (0 < height) {
      uVar9 = (ulong)(uint)height;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined2 *)((long)pvVar6 + uVar7 * 2) = 0;
    }
    uVar7 = 0;
    uVar8 = 0;
    if (0 < width) {
      uVar8 = (ulong)(uint)width;
    }
    for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
      pcVar2 = FLAG[uVar7];
      cVar14 = *pcVar2;
      for (lVar13 = 1; lVar13 < height; lVar13 = lVar13 + 1) {
        cVar1 = pcVar2[lVar13];
        if (cVar14 != cVar1) {
          *(undefined2 *)((long)pvVar6 + lVar13 * 2) = 1;
          cVar14 = cVar1;
        }
      }
    }
    uVar10 = 0;
    iVar5 = height;
    do {
      iVar11 = height - uVar10;
      if (iVar11 == 0 || height < (int)uVar10) goto LAB_0010e037;
      for (lVar13 = 1; iVar12 = (int)lVar13, uVar4 = height, (int)(uVar10 + iVar12) < height;
          lVar13 = lVar13 + 1) {
        if (*(short *)((long)pvVar6 + lVar13 * 2 + (ulong)uVar10 * 2) != 0) {
          uVar4 = uVar10 + iVar12;
          iVar11 = iVar12;
          break;
        }
      }
      uVar10 = uVar4;
      if (iVar11 < iVar5) {
        iVar5 = iVar11;
      }
    } while (iVar5 != 1);
    iVar5 = 1;
LAB_0010e037:
    free(pvVar6);
    iVar5 = (height * 2) / iVar5;
    iVar11 = *jmax;
    if (*jmax < iVar5) {
      iVar11 = iVar5;
    }
    pvVar6 = malloc((long)(short)width * 2);
    if (pvVar6 != (void *)0x0) {
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        *(undefined2 *)((long)pvVar6 + uVar7 * 2) = 0;
      }
      for (uVar7 = 0; lVar13 = 1, uVar7 != uVar9; uVar7 = uVar7 + 1) {
        for (; lVar13 < width; lVar13 = lVar13 + 1) {
          if (FLAG[lVar13][uVar7] != FLAG[lVar13 + -1][uVar7]) {
            *(undefined2 *)((long)pvVar6 + lVar13 * 2) = 1;
          }
        }
      }
      uVar10 = 0;
      iVar5 = width;
      do {
        iVar12 = width - uVar10;
        if (iVar12 == 0 || width < (int)uVar10) goto LAB_0010e103;
        for (lVar13 = 1; iVar3 = (int)lVar13, uVar4 = width, (int)(uVar10 + iVar3) < width;
            lVar13 = lVar13 + 1) {
          if (*(short *)((long)pvVar6 + lVar13 * 2 + (ulong)uVar10 * 2) != 0) {
            uVar4 = uVar10 + iVar3;
            iVar12 = iVar3;
            break;
          }
        }
        uVar10 = uVar4;
        if (iVar12 < iVar5) {
          iVar5 = iVar12;
        }
      } while (iVar5 != 1);
      iVar5 = 1;
LAB_0010e103:
      free(pvVar6);
      iVar5 = (width * 2) / iVar5;
      iVar12 = *imax;
      if (*imax < iVar5) {
        iVar12 = iVar5;
      }
      *jmax = iVar11;
      *imax = iVar12;
    }
  }
  return;
}

Assistant:

void findOptimalFlags (char **FLAG, int height, int width, int *imax, int *jmax)
{
	if (!FLAG || !imax || !jmax)
		return;
	if (!height || !width)
		return;
	/* Find the structure size in y-direction */
	int blockType, blockSize = height;
	int newHeight, newWidth;
	int i, j;
	short *structureVec = malloc(((short)height)*sizeof(short));
	if (structureVec == NULL)
		return;
	for (j = 0; j < height; j++)
		structureVec[j] = 0;
	for (i = 0; i < width; i++)
	{
		blockType = FLAG[i][0];
		for (j = 1; j < height; j++)
		{
			if (FLAG[i][j] != blockType)
			{
				structureVec[j] = 1;
				blockType = FLAG[i][j];
			}
		}
	}
	for (j = 0; j < height; j+=i)
	{
		i = 1;
		while (j+i < height && structureVec[j+i] == 0)
		{
			i++;
		}
		if (i < blockSize)
			blockSize = i;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the height necessary to represent the image, but no less than *jmax */
	newHeight = (height * 2)/blockSize;
	if (newHeight < *jmax)
		newHeight = *jmax;
	/* Now do exactly the same thing for the x-direction */
	blockSize = width;
	structureVec = malloc((short)width*sizeof(short));
	if (structureVec == NULL)
		return;
	for (i = 0; i < width; i++)
		structureVec[i] = 0;
	for (j = 0; j < height; j++)
	{
		blockType = FLAG[0][j];
		for (i = 1; i < width; i++)
		{
			if (FLAG[i][j] != blockType)
				structureVec[i] = 1;
			blockType = FLAG[i][j];
		}
	}
	for (i = 0; i < width; i+=j)
	{
		j = 1;
		while (j+i < width && structureVec[j+i] == 0)
		{
			j++;
		}
		if (j < blockSize)
			blockSize = j;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the width necessary to represent the image, but no less than *imax */
	newWidth = (width * 2)/blockSize;
	if (newWidth < *imax)
		newWidth = *imax;
	*jmax = newHeight;
	*imax = newWidth;
	return;
}